

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O2

void __thiscall
duckdb::DuckSchemaEntry::Alter(DuckSchemaEntry *this,CatalogTransaction transaction,AlterInfo *info)

{
  bool bVar1;
  int iVar2;
  CatalogSet *this_00;
  CatalogException *pCVar3;
  string name;
  string local_50;
  
  iVar2 = (*(info->super_ParseInfo)._vptr_ParseInfo[3])(info);
  this_00 = GetCatalogSet(this,(CatalogType)iVar2);
  if ((info->super_ParseInfo).field_0x9 == '\x04') {
    bVar1 = CatalogSet::AlterOwnership(this_00,transaction,(ChangeOwnershipInfo *)info);
    if (!bVar1) {
      pCVar3 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&name,"Couldn\'t change ownership!",(allocator *)&local_50);
      CatalogException::CatalogException(pCVar3,&name);
      __cxa_throw(pCVar3,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    ::std::__cxx11::string::string((string *)&name,(string *)&info->name);
    bVar1 = CatalogSet::AlterEntry(this_00,transaction,&name,info);
    if (!bVar1) {
      pCVar3 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      CatalogException::MissingEntry
                (pCVar3,(CatalogType)iVar2,&name,&local_50,(QueryErrorContext)0xffffffffffffffff);
      __cxa_throw(pCVar3,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::~string((string *)&name);
  }
  return;
}

Assistant:

void DuckSchemaEntry::Alter(CatalogTransaction transaction, AlterInfo &info) {
	CatalogType type = info.GetCatalogType();

	auto &set = GetCatalogSet(type);
	if (info.type == AlterType::CHANGE_OWNERSHIP) {
		if (!set.AlterOwnership(transaction, info.Cast<ChangeOwnershipInfo>())) {
			throw CatalogException("Couldn't change ownership!");
		}
	} else {
		string name = info.name;
		if (!set.AlterEntry(transaction, name, info)) {
			throw CatalogException::MissingEntry(type, name, string());
		}
	}
}